

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Utilities.h
# Opt level: O2

string * __thiscall
soul::heart::Utilities::getDescriptionOfTypeList_abi_cxx11_
          (string *__return_storage_ptr__,Utilities *this,ArrayView<soul::Type> types,
          bool alwaysParenthesise)

{
  string *psVar1;
  Type *pTVar2;
  size_t i;
  ulong i_00;
  allocator<char> local_c9;
  string *local_c8;
  ArrayView<soul::Type> types_local;
  string local_b0;
  string local_90 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  types_local.e = types.s;
  local_c8 = __return_storage_ptr__;
  types_local.s = (Type *)this;
  if ((int)types.e == 0) {
    if ((Type *)this == types_local.e) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      __return_storage_ptr__->_M_string_length = 0;
      (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
      return __return_storage_ptr__;
    }
    if ((long)types_local.e - (long)this == 0x18) {
      pTVar2 = ArrayView<soul::Type>::front(&types_local);
      psVar1 = local_c8;
      Type::getDescription_abi_cxx11_(local_c8,pTVar2);
      return psVar1;
    }
  }
  std::__cxx11::string::string<std::allocator<char>>(local_90,", ",&local_c9);
  if (types_local.s == types_local.e) {
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    local_b0._M_string_length = 0;
    local_b0.field_2._M_local_buf[0] = '\0';
  }
  else {
    pTVar2 = ArrayView<soul::Type>::front(&types_local);
    Type::getDescription_abi_cxx11_(&local_b0,pTVar2);
    for (i_00 = 1; i_00 < (ulong)(((long)types_local.e - (long)types_local.s) / 0x18);
        i_00 = i_00 + 1) {
      std::__cxx11::string::append((string *)&local_b0);
      pTVar2 = ArrayView<soul::Type>::operator[](&types_local,i_00);
      Type::getDescription_abi_cxx11_(&local_50,pTVar2);
      std::__cxx11::string::append((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_50);
    }
  }
  std::operator+(&local_70,"(",&local_b0);
  std::operator+(local_c8,&local_70,")");
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string(local_90);
  return local_c8;
}

Assistant:

static std::string getDescriptionOfTypeList (ArrayView<Type> types, bool alwaysParenthesise)
    {
        if (! alwaysParenthesise)
        {
            if (types.empty())
                return {};

            if (types.size() == 1)
                return types.front().getDescription();
        }

        return "(" + joinStrings (types, ", ", [] (auto& t) { return t.getDescription(); }) + ")";
    }